

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O0

void strange_feeling(obj *obj,char *txt)

{
  boolean bVar1;
  char *pcVar2;
  bool bVar3;
  char *txt_local;
  obj *obj_local;
  
  if ((flags.beginner == '\0') && (txt != (char *)0x0)) {
    pline(txt);
  }
  else {
    bVar3 = false;
    if (u.uprops[0x23].intrinsic != 0) {
      bVar3 = true;
      if ((u.uprops[0x24].extrinsic == 0) && (bVar3 = false, u.umonnum != u.umonster)) {
        bVar1 = dmgtype(youmonst.data,0x24);
        bVar3 = bVar1 != '\0';
      }
      bVar3 = (bool)(bVar3 ^ 1);
    }
    pcVar2 = "strange";
    if (bVar3) {
      pcVar2 = "normal";
    }
    pline("You have a %s feeling for a moment, then it passes.",pcVar2);
  }
  if (obj != (obj *)0x0) {
    if ((((*(uint *)&obj->field_0x4a >> 5 & 1) != 0) && ((objects[obj->otyp].field_0x10 & 1) == 0))
       && (objects[obj->otyp].oc_uname == (char *)0x0)) {
      docall(obj);
    }
    useup(obj);
  }
  return;
}

Assistant:

void strange_feeling(struct obj *obj, const char *txt)
{
	if (flags.beginner || !txt)
		pline("You have a %s feeling for a moment, then it passes.",
		Hallucination ? "normal" : "strange");
	else
		pline(txt);

	if (!obj)	/* e.g., crystal ball finds no traps */
		return;

	if (obj->dknown && !objects[obj->otyp].oc_name_known &&
						!objects[obj->otyp].oc_uname)
		docall(obj);
	useup(obj);
}